

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Vfs_putenv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *pcVar1;
  void *pvVar2;
  code *pcVar3;
  int iVar4;
  undefined8 in_RAX;
  char *pcVar5;
  long lVar6;
  jx9_value *pjVar7;
  char *pcVar8;
  anon_union_8_3_18420de5_for_x aVar9;
  int iLen;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pcVar5 = jx9_value_to_string(*apArg,(int *)&local_24);
    lVar6 = (long)(int)local_24;
    if (0 < lVar6) {
      pcVar8 = pcVar5;
      do {
        local_24 = local_24 - 1;
        if (*pcVar8 == '=') {
          *pcVar8 = '\0';
          pcVar1 = pcVar8 + 1;
          if ((pcVar5 < pcVar1 && pcVar1 < pcVar5 + lVar6) && *pcVar5 != '\0') {
            jx9_vm_config(pCtx->pVm,9,pcVar5,pcVar1,(ulong)local_24);
            pvVar2 = pCtx->pFunc->pUserData;
            if ((pvVar2 != (void *)0x0) &&
               (pcVar3 = *(code **)((long)pvVar2 + 0xf8), pcVar3 != (code *)0x0)) {
              iVar4 = (*pcVar3)(pcVar5,pcVar1);
              aVar9.iVal._1_7_ = 0;
              aVar9.iVal._0_1_ = iVar4 == 0;
              pjVar7 = pCtx->pRet;
              jx9MemObjRelease(pjVar7);
              pjVar7->x = aVar9;
              goto LAB_0013ab31;
            }
            jx9_context_throw_error_format
                      (pCtx,2,
                       "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
                       ,(pCtx->pFunc->sName).zString);
          }
          pjVar7 = pCtx->pRet;
          jx9MemObjRelease(pjVar7);
          (pjVar7->x).rVal = 0.0;
LAB_0013ab31:
          pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | 8;
          *pcVar8 = '=';
          return 0;
        }
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 < pcVar5 + lVar6);
    }
  }
  pjVar7 = pCtx->pRet;
  jx9MemObjRelease(pjVar7);
  (pjVar7->x).rVal = 0.0;
  pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Vfs_putenv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName, *zValue;
	char *zSettings, *zEnd;
	jx9_vfs *pVfs;
	int iLen, rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the setting variable */
	zSettings = (char *)jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Parse the setting */
	zEnd = &zSettings[iLen];
	zValue = 0;
	zName = zSettings;
	while( zSettings < zEnd ){
		if( zSettings[0] == '=' ){
			/* Null terminate the name */
			zSettings[0] = 0;
			zValue = &zSettings[1];
			break;
		}
		zSettings++;
	}
	/* Install the environment variable in the $_Env array */
	if( zValue == 0 || zName[0] == 0 || zValue >= zEnd || zName >= zValue ){
		/* Invalid settings, retun FALSE */
		jx9_result_bool(pCtx, 0);
		if( zSettings  < zEnd ){
			zSettings[0] = '=';
		}
		return JX9_OK;
	}
	jx9_vm_config(pCtx->pVm, JX9_VM_CONFIG_ENV_ATTR, zName, zValue, (int)(zEnd-zValue));
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xSetenv == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		zSettings[0] = '=';
		return JX9_OK;
	}
	/* Perform the requested operation */
	rc = pVfs->xSetenv(zName, zValue);
	jx9_result_bool(pCtx, rc == JX9_OK );
	zSettings[0] = '=';
	return JX9_OK;
}